

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser_error parse_race_relations_dislike(parser *p)

{
  undefined8 uVar1;
  wchar_t wVar2;
  void *pvVar3;
  char *pcVar4;
  player_race *ppVar5;
  void *pvVar6;
  player_race_list *list;
  player_race *d;
  char *name;
  player_race *r;
  parser *p_local;
  
  pvVar3 = parser_priv(p);
  pcVar4 = parser_getsym(p,"name");
  ppVar5 = player_race_from_name(pcVar4);
  if (pvVar3 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else if (ppVar5 == (player_race *)0x0) {
    p_local._4_4_ = PARSE_ERROR_INVALID_PLAY_RACE_NAME;
  }
  else {
    uVar1 = *(undefined8 *)((long)pvVar3 + 0x10);
    pvVar6 = mem_zalloc(0x20);
    *(void **)((long)pvVar3 + 0x10) = pvVar6;
    **(undefined8 **)((long)pvVar3 + 0x10) = uVar1;
    *(player_race **)(*(long *)((long)pvVar3 + 0x10) + 0x10) = ppVar5;
    pcVar4 = string_make(pcVar4);
    *(char **)(*(long *)((long)pvVar3 + 0x10) + 8) = pcVar4;
    wVar2 = parser_getint(p,"rel");
    *(wchar_t *)(*(long *)((long)pvVar3 + 0x10) + 0x18) = wVar2;
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_race_relations_dislike(struct parser *p) {
	struct player_race *r = parser_priv(p);
	const char *name = parser_getsym(p, "name");
	struct player_race *d = player_race_from_name(name);
	struct player_race_list *list;

	if (!r)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	if (!d)
		return PARSE_ERROR_INVALID_PLAY_RACE_NAME;
	list = r->dislikes;
	r->dislikes = mem_zalloc(sizeof(struct player_race_list));
	r->dislikes->next = list;
	r->dislikes->race = d;
	r->dislikes->name = string_make(name);
	r->dislikes->rel = parser_getint(p, "rel");
	return PARSE_ERROR_NONE;
}